

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_Writer.cpp
# Opt level: O0

void __thiscall OSTEI_Writer::WriteAccumulation(OSTEI_Writer *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  QAM *am;
  long in_RDI;
  QAM *it_2;
  iterator __end1_2;
  iterator __begin1_2;
  QAMSet *__range1_2;
  int ncart_1;
  QAM *it_1;
  iterator __end1_1;
  iterator __begin1_1;
  QAMSet *__range1_1;
  int ncart;
  QAM *it;
  iterator __end1;
  iterator __begin1;
  QAMSet *__range1;
  QAMSet topq;
  OSTEI_HRR_Algorithm_Base *in_stack_fffffffffffffd18;
  QAM *in_stack_fffffffffffffd20;
  QAM *in_stack_fffffffffffffd40;
  QAM *in_stack_fffffffffffffd68;
  string local_1b8 [32];
  reference local_198;
  _Self local_190;
  _Self local_188;
  undefined1 *local_180;
  string local_178 [32];
  string local_158 [84];
  int local_104;
  reference local_100;
  _Self local_f8;
  _Self local_f0;
  undefined1 *local_e8;
  string local_e0 [32];
  string local_c0 [84];
  int local_6c;
  reference local_68;
  _Self local_60;
  _Self local_58;
  undefined1 *local_50;
  undefined1 local_38 [56];
  
  OSTEI_HRR_Writer::Algo(*(OSTEI_HRR_Writer **)(in_RDI + 0x28));
  OSTEI_HRR_Algorithm_Base::TopAM(in_stack_fffffffffffffd18);
  std::operator<<(*(ostream **)(in_RDI + 8),"\n\n");
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar3,"////////////////////////////////////\n");
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar3,"// Accumulate contracted integrals\n");
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar3,"////////////////////////////////////\n");
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar3,"if(lastoffset == 0)\n");
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar3,"{\n");
  local_50 = local_38;
  local_58._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::begin
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)in_stack_fffffffffffffd18);
  local_60._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::end
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)in_stack_fffffffffffffd18);
  while( true ) {
    bVar1 = std::operator!=(&local_58,&local_60);
    if (!bVar1) break;
    local_68 = std::_Rb_tree_const_iterator<QAM>::operator*
                         ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffffd20);
    QAM::QAM(in_stack_fffffffffffffd20,(QAM *)in_stack_fffffffffffffd18);
    iVar2 = NCART(in_stack_fffffffffffffd40);
    QAM::~QAM((QAM *)0x153d01);
    local_6c = iVar2;
    poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent6_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"contract_all(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_6c);
    poVar3 = std::operator<<(poVar3,", ");
    PrimVarName_abi_cxx11_(in_stack_fffffffffffffd68);
    poVar3 = std::operator<<(poVar3,local_c0);
    poVar3 = std::operator<<(poVar3,", ");
    PrimPtrName_abi_cxx11_(in_stack_fffffffffffffd68);
    poVar3 = std::operator<<(poVar3,local_e0);
    std::operator<<(poVar3,");\n");
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_c0);
    std::_Rb_tree_const_iterator<QAM>::operator++
              ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffffd20);
  }
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar3,"}\n");
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar3,"else\n");
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar3,"{\n");
  local_e8 = local_38;
  local_f0._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::begin
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)in_stack_fffffffffffffd18);
  local_f8._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::end
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)in_stack_fffffffffffffd18);
  while( true ) {
    bVar1 = std::operator!=(&local_f0,&local_f8);
    if (!bVar1) break;
    local_100 = std::_Rb_tree_const_iterator<QAM>::operator*
                          ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffffd20);
    QAM::QAM(in_stack_fffffffffffffd20,(QAM *)in_stack_fffffffffffffd18);
    iVar2 = NCART(in_stack_fffffffffffffd40);
    QAM::~QAM((QAM *)0x154025);
    local_104 = iVar2;
    poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent6_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"contract(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_104);
    in_stack_fffffffffffffd68 = (QAM *)std::operator<<(poVar3,", shelloffsets, ");
    PrimVarName_abi_cxx11_(in_stack_fffffffffffffd68);
    poVar3 = std::operator<<((ostream *)in_stack_fffffffffffffd68,local_158);
    poVar3 = std::operator<<(poVar3,", ");
    PrimPtrName_abi_cxx11_(in_stack_fffffffffffffd68);
    poVar3 = std::operator<<(poVar3,local_178);
    std::operator<<(poVar3,");\n");
    std::__cxx11::string::~string(local_178);
    std::__cxx11::string::~string(local_158);
    std::_Rb_tree_const_iterator<QAM>::operator++
              ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffffd20);
  }
  local_180 = local_38;
  local_188._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::begin
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)in_stack_fffffffffffffd18);
  local_190._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::end
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)in_stack_fffffffffffffd18);
  while( true ) {
    bVar1 = std::operator!=(&local_188,&local_190);
    if (!bVar1) break;
    local_198 = std::_Rb_tree_const_iterator<QAM>::operator*
                          ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffffd20);
    poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent6_abi_cxx11_);
    PrimPtrName_abi_cxx11_(in_stack_fffffffffffffd68);
    am = (QAM *)std::operator<<(poVar3,local_1b8);
    poVar3 = std::operator<<((ostream *)am," += lastoffset*");
    QAM::QAM(in_stack_fffffffffffffd20,(QAM *)in_stack_fffffffffffffd18);
    iVar2 = NCART(am);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3,";\n");
    QAM::~QAM((QAM *)0x1542f3);
    std::__cxx11::string::~string(local_1b8);
    std::_Rb_tree_const_iterator<QAM>::operator++
              ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffffd20);
  }
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar3,"}\n");
  std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::~set
            ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)0x154397);
  return;
}

Assistant:

void OSTEI_Writer::WriteAccumulation(void) const
{
    const auto topq = hrr_writer_.Algo().TopAM();

    os_ << "\n\n";
    os_ << indent5 << "////////////////////////////////////\n";
    os_ << indent5 << "// Accumulate contracted integrals\n";
    os_ << indent5 << "////////////////////////////////////\n";

    os_ << indent5 << "if(lastoffset == 0)\n";
    os_ << indent5 << "{\n";

    for(const auto &it : topq)
    {
        int ncart = NCART(it);
        os_ << indent6 << "contract_all(" << ncart << ", " << PrimVarName(it) << ", " << PrimPtrName(it) << ");\n";
    }

    os_ << indent5 << "}\n";
    os_ << indent5 << "else\n";
    os_ << indent5 << "{\n";

    for(const auto &it : topq)
    {
        int ncart = NCART(it);
        os_ << indent6 << "contract(" << ncart << ", shelloffsets, " << PrimVarName(it) << ", " << PrimPtrName(it) << ");\n";
    }

    for(const auto &it : topq)
        os_ << indent6 << PrimPtrName(it) << " += lastoffset*" << NCART(it) << ";\n";

    os_ << indent5 << "}\n";
}